

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

void __thiscall glTF2::Node::Node(Node *this)

{
  Node *this_local;
  
  glTF2::Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_00ed7720;
  std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::vector
            (&this->children);
  std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::vector
            (&this->meshes);
  Nullable<float[16]>::Nullable(&this->matrix);
  Nullable<float[3]>::Nullable(&this->translation);
  Nullable<float[4]>::Nullable(&this->rotation);
  Nullable<float[3]>::Nullable(&this->scale);
  Ref<glTF2::Camera>::Ref(&this->camera);
  Ref<glTF2::Light>::Ref(&this->light);
  std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::vector
            (&this->skeletons);
  Ref<glTF2::Skin>::Ref(&this->skin);
  std::__cxx11::string::string((string *)&this->jointName);
  Ref<glTF2::Node>::Ref(&this->parent);
  return;
}

Assistant:

Node() {}